

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint32 tag,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  int iVar2;
  undefined1 local_60 [8];
  ExtensionInfo extension;
  bool was_packed_on_wire;
  int number;
  FieldSkipper *field_skipper_local;
  ExtensionFinder *extension_finder_local;
  CodedInputStream *input_local;
  uint32 tag_local;
  ExtensionSet *this_local;
  
  ExtensionInfo::ExtensionInfo((ExtensionInfo *)local_60);
  bVar1 = FindExtensionInfoFromTag
                    (this,tag,extension_finder,(int *)((long)&extension.descriptor + 4),
                     (ExtensionInfo *)local_60,(bool *)((long)&extension.descriptor + 3));
  if (bVar1) {
    this_local._7_1_ =
         ParseFieldWithExtensionInfo
                   (this,extension.descriptor._4_4_,(bool)(extension.descriptor._3_1_ & 1),
                    (ExtensionInfo *)local_60,input,field_skipper);
  }
  else {
    iVar2 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)tag);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ExtensionSet::ParseField(uint32 tag, io::CodedInputStream* input,
                              ExtensionFinder* extension_finder,
                              FieldSkipper* field_skipper) {
  int number;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromTag(
      tag, extension_finder, &number, &extension, &was_packed_on_wire)) {
    return field_skipper->SkipField(input, tag);
  } else {
    return ParseFieldWithExtensionInfo(
        number, was_packed_on_wire, extension, input, field_skipper);
  }
}